

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_true>_>_>
::RU_matrix(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_true>_>_>
            *this,RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_true>_>_>
                  *other)

{
  uint uVar1;
  Z2_field_operators *pZVar2;
  void *local_28;
  int local_1c;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_true>_>_>
  *local_18;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_true>_>_>
  *other_local;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_true>_>_>
  *this_local;
  
  local_18 = other;
  other_local = this;
  RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_true>_>_>
  ::RU_pairing(&this->super_RU_pairing_option,&other->super_RU_pairing_option);
  RU_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_true>_>_>
  ::RU_representative_cycles
            (&this->super_RU_representative_cycles_option,
             &local_18->super_RU_representative_cycles_option);
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_true>_>_>
  ::Boundary_matrix(&this->reducedMatrixR_,&local_18->reducedMatrixR_);
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_true>_>_>
  ::Base_matrix(&this->mirrorMatrixU_,&local_18->mirrorMatrixU_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->pivotToColumnIndex_,&local_18->pivotToColumnIndex_);
  local_1c = 0;
  uVar1 = std::exchange<unsigned_int,int>(&local_18->nextEventIndex_,&local_1c);
  this->nextEventIndex_ = uVar1;
  local_28 = (void *)0x0;
  pZVar2 = std::exchange<Gudhi::persistence_fields::Z2_field_operators*,decltype(nullptr)>
                     (&local_18->operators_,&local_28);
  this->operators_ = pZVar2;
  return;
}

Assistant:

inline RU_matrix<Master_matrix>::RU_matrix(RU_matrix&& other) noexcept
    : Pair_opt(std::move(static_cast<Pair_opt&>(other))),
      Swap_opt(std::move(static_cast<Swap_opt&>(other))),
      Rep_opt(std::move(static_cast<Rep_opt&>(other))),
      reducedMatrixR_(std::move(other.reducedMatrixR_)),
      mirrorMatrixU_(std::move(other.mirrorMatrixU_)),
      pivotToColumnIndex_(std::move(other.pivotToColumnIndex_)),
      nextEventIndex_(std::exchange(other.nextEventIndex_, 0)),
      operators_(std::exchange(other.operators_, nullptr))
{}